

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O3

string * duckdb::StrpTimeFormat::FormatStrpTimeError
                   (string *__return_storage_ptr__,string *input,optional_idx position)

{
  undefined8 *puVar1;
  pointer pcVar2;
  long lVar3;
  idx_t iVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  optional_idx local_20;
  
  if (position.index == 0xffffffffffffffff) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  pcVar2 = (input->_M_dataplus)._M_p;
  local_60 = local_50;
  local_20.index = position.index;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + input->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_60);
  iVar4 = optional_idx::GetIndex(&local_20);
  local_40 = local_30;
  ::std::__cxx11::string::_M_construct((ulong)&local_40,(char)iVar4);
  uVar8 = 0xf;
  if (local_60 != local_50) {
    uVar8 = local_50[0];
  }
  if (uVar8 < (ulong)(local_38 + local_58)) {
    uVar8 = 0xf;
    if (local_40 != local_30) {
      uVar8 = local_30[0];
    }
    if ((ulong)(local_38 + local_58) <= uVar8) {
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,(ulong)local_60);
      goto LAB_011221ce;
    }
  }
  puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40);
LAB_011221ce:
  local_80 = &local_70;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_70 = *puVar1;
    uStack_68 = puVar5[3];
  }
  else {
    local_70 = *puVar1;
    local_80 = (undefined8 *)*puVar5;
  }
  local_78 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)::std::__cxx11::string::append((char *)&local_80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

string StrpTimeFormat::FormatStrpTimeError(const string &input, optional_idx position) {
	if (!position.IsValid()) {
		return string();
	}
	return input + "\n" + string(position.GetIndex(), ' ') + "^";
}